

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptObject.cpp
# Opt level: O3

char16 * Js::JavascriptObject::ConstructName
                   (PropertyRecord *propertyRecord,char16 *getOrSetStr,ScriptContext *scriptContext)

{
  short sVar1;
  char16 cVar2;
  code *pcVar3;
  bool bVar4;
  BOOL BVar5;
  undefined4 *puVar6;
  Recycler *this;
  char16 *pcVar7;
  size_t sVar8;
  size_t sVar9;
  char *pcVar10;
  ulong uVar11;
  ulong uVar12;
  size_t __n;
  uint uVar13;
  undefined1 local_60 [8];
  TrackAllocData data;
  
  if (propertyRecord == (PropertyRecord *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar6 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptObject.cpp"
                                ,0x829,"(propertyRecord)","propertyRecord");
    if (!bVar4) goto LAB_00ce5b96;
    *puVar6 = 0;
  }
  if (scriptContext == (ScriptContext *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar6 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptObject.cpp"
                                ,0x82a,"(scriptContext)","scriptContext");
    if (!bVar4) goto LAB_00ce5b96;
    *puVar6 = 0;
  }
  if (propertyRecord->byteCount < 2) {
    pcVar7 = (char16 *)0x0;
  }
  else {
    uVar13 = propertyRecord->byteCount >> 1;
    uVar12 = (ulong)uVar13;
    data.plusSize = uVar12 + 5;
    local_60 = (undefined1  [8])&char16_t::typeinfo;
    data.typeinfo = (type_info *)0x0;
    data.count = (size_t)anon_var_dwarf_7b0957b;
    data.filename._0_4_ = 0x832;
    data._32_8_ = data.plusSize;
    this = Memory::Recycler::TrackAllocInfo(scriptContext->recycler,(TrackAllocData *)local_60);
    BVar5 = ExceptionCheck::CanHandleOutOfMemory();
    if (BVar5 == 0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar6 = 1;
      bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                                  ,0x1fb,"(ExceptionCheck::CanHandleOutOfMemory())",
                                  "ExceptionCheck::CanHandleOutOfMemory()");
      if (!bVar4) goto LAB_00ce5b96;
      *puVar6 = 0;
    }
    sVar9 = uVar12 * 2 + 10;
    pcVar7 = (char16 *)
             Memory::Recycler::AllocZeroWithAttributes<(Memory::ObjectInfoBits)32,false>(this,sVar9)
    ;
    if (pcVar7 == (char16 *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar6 = 1;
      bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                                  ,0x1fe,"(buffer != nullptr)","buffer != nullptr");
      if (!bVar4) goto LAB_00ce5b96;
      *puVar6 = 0;
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      *puVar6 = 1;
      bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptObject.cpp"
                                  ,0x833,"(finalName != nullptr)","finalName != nullptr");
      if (!bVar4) goto LAB_00ce5b96;
      *puVar6 = 0;
    }
    else {
      uVar11 = 1;
      sVar8 = 0;
      do {
        sVar1 = *(short *)((long)&propertyRecord[1].super_FinalizableObject.
                                  super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject + sVar8)
        ;
        *(short *)((long)pcVar7 + sVar8) = sVar1;
        if (sVar1 == 0) {
          if (uVar11 < (ulong)data._32_8_) {
            memset((char *)((long)pcVar7 + sVar8 + 2),0xfd,(uVar12 * 2 - sVar8) + 8);
          }
          goto LAB_00ce5a28;
        }
        sVar8 = sVar8 + 2;
        uVar11 = uVar11 + 1;
      } while (sVar9 != sVar8);
      *pcVar7 = L'\0';
      memset(pcVar7 + 1,0xfd,uVar12 * 2 + 8);
    }
    RaiseException(0xc000000d,0,0,(ULONG_PTR *)0x0);
LAB_00ce5a28:
    if (getOrSetStr == (char16 *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar6 = 1;
      bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptObject.cpp"
                                  ,0x838,"(getOrSetStr != nullptr)","getOrSetStr != nullptr");
      if (!bVar4) goto LAB_00ce5b96;
      *puVar6 = 0;
    }
    sVar9 = PAL_wcslen(getOrSetStr);
    if (sVar9 != 4) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar6 = 1;
      bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptObject.cpp"
                                  ,0x839,"(PAL_wcslen(getOrSetStr) == 4)","wcslen(getOrSetStr) == 4"
                                 );
      if (!bVar4) {
LAB_00ce5b96:
        pcVar3 = (code *)invalidInstructionException();
        (*pcVar3)();
      }
      *puVar6 = 0;
    }
    pcVar10 = (char *)((long)pcVar7 + (ulong)(uVar13 * 2));
    if (pcVar10 != (char *)0x0) {
      if (getOrSetStr != (char16 *)0x0) {
        uVar12 = 1;
        __n = 8;
        do {
          cVar2 = getOrSetStr[uVar12 - 1];
          *(char16 *)(pcVar10 + uVar12 * 2 + -2) = cVar2;
          if (cVar2 == L'\0') {
            if (4 < uVar12) {
              return pcVar7;
            }
            memset(pcVar10 + uVar12 * 2,0xfd,__n);
            return pcVar7;
          }
          uVar12 = uVar12 + 1;
          __n = __n - 2;
        } while (__n != 0xfffffffffffffffe);
      }
      pcVar10[0] = '\0';
      pcVar10[1] = '\0';
      pcVar10[2] = -3;
      pcVar10[3] = -3;
      pcVar10[4] = -3;
      pcVar10[5] = -3;
      pcVar10[6] = -3;
      pcVar10[7] = -3;
      pcVar10[8] = -3;
      pcVar10[9] = -3;
    }
    RaiseException(0xc000000d,0,0,(ULONG_PTR *)0x0);
  }
  return pcVar7;
}

Assistant:

char16 * JavascriptObject::ConstructName(const PropertyRecord * propertyRecord, const char16 * getOrSetStr, ScriptContext* scriptContext)
{
    Assert(propertyRecord);
    Assert(scriptContext);
    char16 * finalName = nullptr;
    size_t propertyLength = (size_t)propertyRecord->GetLength();
    if (propertyLength > 0)
    {
        size_t totalChars;
        if (SizeTAdd(propertyLength, ConstructNameGetSetLength, &totalChars) == S_OK)
        {
            finalName = RecyclerNewArrayLeafZ(scriptContext->GetRecycler(), char16, totalChars);
            Assert(finalName != nullptr);
            const char16* propertyName = propertyRecord->GetBuffer();
            Assert(propertyName != nullptr);
            wcscpy_s(finalName, totalChars, propertyName);

            Assert(getOrSetStr != nullptr);
            Assert(wcslen(getOrSetStr) == 4);

            wcscpy_s(finalName + propertyLength, ConstructNameGetSetLength, getOrSetStr);
        }
    }
    return finalName;
}